

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void spo_wallwalk(sp_coder *coder,level *lev)

{
  xchar local_3a;
  xchar local_39;
  xchar y;
  opvar *poStack_38;
  xchar x;
  opvar *chance;
  opvar *bgtyp;
  opvar *fgtyp;
  opvar *coord;
  level *lev_local;
  sp_coder *coder_local;
  
  coord = (opvar *)lev;
  lev_local = (level *)coder;
  poStack_38 = splev_stack_getdat(coder,'\x01');
  if ((((poStack_38 != (opvar *)0x0) &&
       (chance = splev_stack_getdat((sp_coder *)lev_local,'\x06'), chance != (opvar *)0x0)) &&
      (bgtyp = splev_stack_getdat((sp_coder *)lev_local,'\x06'), bgtyp != (opvar *)0x0)) &&
     (fgtyp = splev_stack_getdat((sp_coder *)lev_local,'\x04'), fgtyp != (opvar *)0x0)) {
    local_39 = (xchar)(fgtyp->vardata).l;
    local_3a = (xchar)((ulong)(fgtyp->vardata).l >> 0x10);
    get_location((level *)coord,&local_39,&local_3a,3,*(mkroom **)(lev_local->levname + 0x18));
    if ((((bgtyp->vardata).l & 0xffU) < 0x27) && (((chance->vardata).l & 0xffU) < 0x27)) {
      wallwalk_right((level *)coord,local_39,local_3a,(schar)(bgtyp->vardata).l,
                     (schar)((ulong)(bgtyp->vardata).l >> 8),(schar)(chance->vardata).l,
                     (int)(poStack_38->vardata).l);
      if (fgtyp == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_wallwalk");
      }
      else {
        opvar_free_x(fgtyp);
        fgtyp = (opvar *)0x0;
      }
      if (poStack_38 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_wallwalk");
      }
      else {
        opvar_free_x(poStack_38);
        poStack_38 = (opvar *)0x0;
      }
      if (bgtyp == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_wallwalk");
      }
      else {
        opvar_free_x(bgtyp);
        bgtyp = (opvar *)0x0;
      }
      if (chance == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_wallwalk");
      }
      else {
        opvar_free_x(chance);
      }
    }
  }
  return;
}

Assistant:

static void spo_wallwalk(struct sp_coder *coder, struct level *lev)
{
	struct opvar *coord, *fgtyp, *bgtyp, *chance;
	xchar x, y;

	if (!OV_pop_i(chance) ||
	    !OV_pop_typ(bgtyp, SPOVAR_MAPCHAR) ||
	    !OV_pop_typ(fgtyp, SPOVAR_MAPCHAR) ||
	    !OV_pop_c(coord)) return;

	x = SP_COORD_X(OV_i(coord));
	y = SP_COORD_Y(OV_i(coord));
	get_location(lev, &x, &y, DRY|WET, coder->croom);

	if (SP_MAPCHAR_TYP(OV_i(fgtyp)) >= MAX_TYPE) return;
	if (SP_MAPCHAR_TYP(OV_i(bgtyp)) >= MAX_TYPE) return;

	wallwalk_right(lev, x, y,
		       SP_MAPCHAR_TYP(OV_i(fgtyp)), SP_MAPCHAR_LIT(OV_i(fgtyp)),
		       SP_MAPCHAR_TYP(OV_i(bgtyp)), OV_i(chance));

	opvar_free(coord);
	opvar_free(chance);
	opvar_free(fgtyp);
	opvar_free(bgtyp);
}